

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O1

bool lunasvg::parseSelectors(string_view *input,SelectorList *selectors)

{
  char cVar1;
  byte *pbVar2;
  uint uVar3;
  PropertyID PVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  char *pcVar8;
  void *pvVar9;
  ulong uVar10;
  size_t sVar11;
  Combinator CVar12;
  Combinator CVar13;
  pointer pSVar14;
  pointer pvVar15;
  byte bVar16;
  size_type __n;
  size_t __n_00;
  string name;
  string name_1;
  Selector selector;
  undefined8 local_100;
  _Alloc_hider local_f8;
  undefined1 local_f0 [31];
  byte local_d1;
  undefined1 local_d0 [24];
  pointer local_b8;
  string_view local_b0;
  Combinator local_9c;
  vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> local_98;
  char *local_78;
  vector<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>,std::allocator<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>>>
  *local_70;
  SimpleSelector local_68;
  
  local_70 = (vector<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>,std::allocator<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>>>
              *)selectors;
  do {
    local_98.super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CVar12 = None;
    do {
      local_68.id = Star;
      local_68.pseudoClassSelectors.
      super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.pseudoClassSelectors.
      super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.attributeSelectors.
      super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.pseudoClassSelectors.
      super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.attributeSelectors.
      super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.attributeSelectors.
      super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_100 = (pointer)local_f0;
      local_f8._M_p = (char *)0x0;
      uVar10 = (ulong)local_f0._0_8_ >> 8;
      local_f0._0_8_ = uVar10 << 8;
      sVar11 = input->_M_len;
      local_68.combinator = CVar12;
      if (sVar11 == 0) {
LAB_0011b566:
        bVar5 = false;
      }
      else {
        if (*input->_M_str == '*') {
          input->_M_str = input->_M_str + 1;
          input->_M_len = sVar11 - 1;
          local_68.id = Star;
        }
        else {
          if ((sVar11 == 0) ||
             (((bVar6 = *input->_M_str, 0x19 < (int)(char)(bVar6 & 0xdf) - 0x41U && (bVar6 != 0x5f))
              && (bVar6 != 0x2d)))) goto LAB_0011b566;
          local_f8._M_p = (char *)0x0;
          local_f0._0_8_ = uVar10 << 8;
          std::__cxx11::string::push_back('\0');
          while( true ) {
            pcVar8 = input->_M_str;
            input->_M_str = pcVar8 + 1;
            input->_M_len = input->_M_len - 1;
            if (input->_M_len == 0) break;
            cVar1 = pcVar8[1];
            if (((0x19 < ((int)cVar1 & 0xffffffdfU) - 0x41) && (cVar1 != '-')) &&
               ((cVar1 != '_' && (9 < (int)cVar1 - 0x30U)))) break;
            std::__cxx11::string::push_back('\0');
          }
          local_d0._0_8_ = local_f8._M_p;
          local_d0._8_8_ = local_100;
          local_68.id = elementid((string_view *)local_d0);
        }
        bVar5 = true;
      }
      local_9c = CVar12;
      if (local_100 != (pointer)local_f0) {
        operator_delete(local_100,
                        (ulong)((long)&(((_Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                                          *)local_f0._0_8_)->_M_impl).super__Vector_impl_data.
                                       _M_start + 1));
      }
      bVar6 = 0;
      do {
        if ((input->_M_len == 0) || (*input->_M_str != '#')) {
          if ((input->_M_len != 0) && (*input->_M_str == '.')) {
            input->_M_str = input->_M_str + 1;
            input->_M_len = input->_M_len - 1;
            local_f8._M_p = local_f0 + 8;
            local_f0._0_8_ = (pointer)0x0;
            local_f0[8] = '\0';
            local_100._0_5_ = 0x300000000;
            local_100 = (pointer)CONCAT44(local_100._4_4_,3);
            if (input->_M_len == 0) {
LAB_0011ba96:
              bVar5 = false;
            }
            else {
              bVar6 = *input->_M_str;
              if (((0x19 < (int)(char)(bVar6 & 0xdf) - 0x41U) && (bVar6 != 0x5f)) && (bVar6 != 0x2d)
                 ) goto LAB_0011ba96;
              local_f0._0_8_ = (pointer)0x0;
              local_f0[8] = '\0';
              std::__cxx11::string::push_back((char)&local_f8);
              pcVar8 = input->_M_str + 1;
              input->_M_str = pcVar8;
              input->_M_len = input->_M_len - 1;
              bVar5 = true;
              sVar11 = input->_M_len;
              while (sVar11 != 0) {
                cVar1 = *pcVar8;
                if (((0x19 < ((int)cVar1 & 0xffffffdfU) - 0x41) && (cVar1 != '-')) &&
                   ((cVar1 != '_' && (9 < (int)cVar1 - 0x30U)))) break;
                std::__cxx11::string::push_back((char)&local_f8);
                pcVar8 = input->_M_str + 1;
                input->_M_str = pcVar8;
                input->_M_len = input->_M_len - 1;
                sVar11 = input->_M_len;
              }
            }
            if (bVar5 != false) {
              std::vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>::
              emplace_back<lunasvg::AttributeSelector>
                        (&local_68.attributeSelectors,(AttributeSelector *)&local_100);
            }
            goto LAB_0011baad;
          }
          sVar11 = input->_M_len;
          if ((sVar11 == 0) || (*input->_M_str != '[')) {
            if ((input->_M_len == 0) || (*input->_M_str != ':')) {
              if (!bVar5) {
                bVar16 = 0;
                goto LAB_0011c012;
              }
              break;
            }
            input->_M_str = input->_M_str + 1;
            bVar6 = 1;
            sVar11 = input->_M_len - 1;
            input->_M_len = sVar11;
            local_100 = (pointer)local_f0;
            local_f8._M_p = (char *)0x0;
            uVar10 = (ulong)local_f0._0_8_ >> 8;
            local_f0._0_8_ = uVar10 << 8;
            if ((sVar11 != 0) &&
               (((bVar16 = *input->_M_str, (int)(char)(bVar16 & 0xdf) - 0x41U < 0x1a ||
                 (bVar16 == 0x5f)) || (bVar16 == 0x2d)))) {
              local_f8._M_p = (char *)0x0;
              local_f0._0_8_ = uVar10 << 8;
              std::__cxx11::string::push_back('\0');
              while( true ) {
                pcVar8 = input->_M_str;
                input->_M_str = pcVar8 + 1;
                input->_M_len = input->_M_len - 1;
                if (input->_M_len == 0) break;
                cVar1 = pcVar8[1];
                if (((0x19 < ((int)cVar1 & 0xffffffdfU) - 0x41) && (cVar1 != '-')) &&
                   ((cVar1 != '_' && (9 < (int)cVar1 - 0x30U)))) break;
                std::__cxx11::string::push_back('\0');
              }
              local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
              local_d0._8_8_ = (pointer)0x0;
              local_d0._16_8_ = (pointer)0x0;
              local_b8 = (pointer)0x0;
              iVar7 = std::__cxx11::string::compare((char *)&local_100);
              if (iVar7 == 0) {
                local_d0._0_4_ = 1;
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)&local_100);
                if (iVar7 == 0) {
                  local_d0._0_4_ = 2;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)&local_100);
                  if (iVar7 == 0) {
                    local_d0._0_4_ = 4;
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare((char *)&local_100);
                    if (iVar7 == 0) {
                      local_d0._0_4_ = 5;
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare((char *)&local_100);
                      if (iVar7 == 0) {
                        local_d0._0_4_ = 6;
                      }
                      else {
                        iVar7 = std::__cxx11::string::compare((char *)&local_100);
                        if (iVar7 == 0) {
                          local_d0._0_4_ = 7;
                        }
                        else {
                          iVar7 = std::__cxx11::string::compare((char *)&local_100);
                          if (iVar7 == 0) {
                            local_d0._0_4_ = 8;
                          }
                          else {
                            iVar7 = std::__cxx11::string::compare((char *)&local_100);
                            if (iVar7 == 0) {
                              local_d0._0_4_ = 9;
                            }
                            else {
                              iVar7 = std::__cxx11::string::compare((char *)&local_100);
                              if (iVar7 == 0) {
                                local_d0._0_4_ = 10;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              if (local_d0._0_4_ - Is < 2) {
                sVar11 = input->_M_len;
                if (sVar11 != 0) {
                  pbVar2 = (byte *)input->_M_str;
                  do {
                    sVar11 = sVar11 - 1;
                    if ((0x20 < (ulong)*pbVar2) ||
                       ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
                    input->_M_str = (char *)(pbVar2 + 1);
                    input->_M_len = sVar11;
                    pbVar2 = pbVar2 + 1;
                  } while (sVar11 != 0);
                }
                sVar11 = input->_M_len;
                bVar6 = 1;
                if ((sVar11 != 0) && (*input->_M_str == '(')) {
                  input->_M_str = input->_M_str + 1;
                  input->_M_len = sVar11 - 1;
                  if (sVar11 - 1 != 0) {
                    sVar11 = sVar11 - 2;
                    pbVar2 = (byte *)input->_M_str;
                    do {
                      if ((0x20 < (ulong)*pbVar2) ||
                         ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
                      input->_M_str = (char *)(pbVar2 + 1);
                      input->_M_len = sVar11;
                      bVar5 = sVar11 != 0;
                      sVar11 = sVar11 - 1;
                      pbVar2 = pbVar2 + 1;
                    } while (bVar5);
                  }
                  bVar5 = parseSelectors(input,(SelectorList *)(local_d0 + 8));
                  if (bVar5) {
                    sVar11 = input->_M_len;
                    if (sVar11 != 0) {
                      pbVar2 = (byte *)input->_M_str;
                      do {
                        sVar11 = sVar11 - 1;
                        if ((0x20 < (ulong)*pbVar2) ||
                           ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
                        input->_M_str = (char *)(pbVar2 + 1);
                        input->_M_len = sVar11;
                        pbVar2 = pbVar2 + 1;
                      } while (sVar11 != 0);
                    }
                    if ((input->_M_len != 0) && (*input->_M_str == ')')) {
                      input->_M_str = input->_M_str + 1;
                      input->_M_len = input->_M_len - 1;
                      goto LAB_0011bee4;
                    }
                  }
                }
              }
              else {
LAB_0011bee4:
                std::
                vector<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
                ::emplace_back<lunasvg::PseudoClassSelector>
                          (&local_68.pseudoClassSelectors,(PseudoClassSelector *)local_d0);
                bVar6 = 0;
              }
              std::
              vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
              ::~vector((vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                         *)(local_d0 + 8));
            }
            pSVar14 = (pointer)local_f0._0_8_;
            pvVar15 = local_100;
            if (local_100 != (pointer)local_f0) goto LAB_0011bfeb;
          }
          else {
            input->_M_str = input->_M_str + 1;
            input->_M_len = sVar11 - 1;
            local_d0._0_8_ = local_d0 + 0x10;
            local_d0._8_8_ = (pointer)0x0;
            uVar10 = (ulong)local_d0._16_8_ >> 8;
            local_d0._16_8_ = uVar10 << 8;
            if (sVar11 - 1 != 0) {
              sVar11 = sVar11 - 2;
              pbVar2 = (byte *)input->_M_str;
              do {
                if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0))
                break;
                input->_M_str = (char *)(pbVar2 + 1);
                input->_M_len = sVar11;
                bVar5 = sVar11 != 0;
                sVar11 = sVar11 - 1;
                pbVar2 = pbVar2 + 1;
              } while (bVar5);
            }
            bVar6 = 1;
            if ((input->_M_len != 0) &&
               (((bVar16 = *input->_M_str, (int)(char)(bVar16 & 0xdf) - 0x41U < 0x1a ||
                 (bVar16 == 0x5f)) || (bVar16 == 0x2d)))) {
              local_d0._8_8_ = (pointer)0x0;
              local_d0._16_8_ = uVar10 << 8;
              std::__cxx11::string::push_back((char)local_d0);
              while( true ) {
                pcVar8 = input->_M_str;
                input->_M_str = pcVar8 + 1;
                input->_M_len = input->_M_len - 1;
                if (input->_M_len == 0) break;
                cVar1 = pcVar8[1];
                if (((0x19 < ((int)cVar1 & 0xffffffdfU) - 0x41) && (cVar1 != '-')) &&
                   ((cVar1 != '_' && (9 < (int)cVar1 - 0x30U)))) break;
                std::__cxx11::string::push_back((char)local_d0);
              }
              local_100._0_4_ = None;
              local_100._4_1_ = Unknown;
              local_f8._M_p = local_f0 + 8;
              local_f0._0_8_ = (pointer)0x0;
              local_f0[8] = '\0';
              local_b0._M_len = local_d0._8_8_;
              local_b0._M_str = (char *)local_d0._0_8_;
              PVar4 = propertyid(&local_b0);
              uVar3 = CONCAT31(local_100._5_3_,PVar4);
              local_100 = (pointer)((ulong)uVar3 << 0x20);
              if ((input->_M_len == 0) || (*input->_M_str != '=')) {
                local_b0._M_len = 2;
                local_b0._M_str = "*=";
                bVar5 = skipString(input,&local_b0);
                if (bVar5) {
                  local_100 = (pointer)CONCAT44(local_100._4_4_,2);
                }
                else {
                  local_b0._M_len = 2;
                  local_b0._M_str = "~=";
                  bVar5 = skipString(input,&local_b0);
                  if (bVar5) {
                    local_100 = (pointer)CONCAT44(local_100._4_4_,3);
                  }
                  else {
                    local_b0._M_len = 2;
                    local_b0._M_str = "^=";
                    bVar5 = skipString(input,&local_b0);
                    if (bVar5) {
                      local_100 = (pointer)CONCAT44(local_100._4_4_,4);
                    }
                    else {
                      local_b0._M_len = 2;
                      local_b0._M_str = "$=";
                      bVar5 = skipString(input,&local_b0);
                      if (bVar5) {
                        local_100 = (pointer)CONCAT44(local_100._4_4_,5);
                      }
                      else {
                        local_b0._M_len = 2;
                        local_b0._M_str = "|=";
                        bVar5 = skipString(input,&local_b0);
                        if (bVar5) {
                          local_100 = (pointer)CONCAT44(local_100._4_4_,6);
                        }
                      }
                    }
                  }
                }
              }
              else {
                input->_M_str = input->_M_str + 1;
                input->_M_len = input->_M_len - 1;
                local_100 = (pointer)CONCAT44(uVar3,1);
              }
              if ((MatchType)local_100 == None) {
LAB_0011bf56:
                sVar11 = input->_M_len;
                if (sVar11 != 0) {
                  pbVar2 = (byte *)input->_M_str;
                  do {
                    sVar11 = sVar11 - 1;
                    if ((0x20 < (ulong)*pbVar2) ||
                       ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
                    input->_M_str = (char *)(pbVar2 + 1);
                    input->_M_len = sVar11;
                    pbVar2 = pbVar2 + 1;
                  } while (sVar11 != 0);
                }
                bVar6 = 1;
                if ((input->_M_len != 0) && (*input->_M_str == ']')) {
                  input->_M_str = input->_M_str + 1;
                  input->_M_len = input->_M_len - 1;
                  std::
                  vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>::
                  emplace_back<lunasvg::AttributeSelector>
                            (&local_68.attributeSelectors,(AttributeSelector *)&local_100);
                  bVar6 = 0;
                }
              }
              else {
                sVar11 = input->_M_len;
                if (sVar11 != 0) {
                  pbVar2 = (byte *)input->_M_str;
                  do {
                    sVar11 = sVar11 - 1;
                    if ((0x20 < (ulong)*pbVar2) ||
                       ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
                    input->_M_str = (char *)(pbVar2 + 1);
                    input->_M_len = sVar11;
                    pbVar2 = pbVar2 + 1;
                  } while (sVar11 != 0);
                }
                sVar11 = input->_M_len;
                bVar6 = 1;
                if (sVar11 != 0) {
                  bVar16 = *input->_M_str;
                  if ((((int)(char)(bVar16 & 0xdf) - 0x41U < 0x1a) || (bVar16 == 0x5f)) ||
                     (bVar16 == 0x2d)) {
                    local_f0._0_8_ = (pointer)0x0;
                    *local_f8._M_p = '\0';
                    std::__cxx11::string::push_back((char)&local_f8);
                    while( true ) {
                      pcVar8 = input->_M_str;
                      input->_M_str = pcVar8 + 1;
                      input->_M_len = input->_M_len - 1;
                      if (input->_M_len == 0) break;
                      cVar1 = pcVar8[1];
                      if (((0x19 < ((int)cVar1 & 0xffffffdfU) - 0x41) && (cVar1 != '-')) &&
                         ((cVar1 != '_' && (9 < (int)cVar1 - 0x30U)))) break;
                      std::__cxx11::string::push_back((char)&local_f8);
                    }
                    goto LAB_0011bf56;
                  }
                  if (sVar11 != 0) {
                    cVar1 = *input->_M_str;
                    if ((cVar1 == '\"') || (cVar1 == '\'')) {
                      pcVar8 = input->_M_str + 1;
                      input->_M_str = pcVar8;
                      __n_00 = sVar11 - 1;
                      input->_M_len = __n_00;
                      if (__n_00 == 0) {
                        uVar10 = 0xffffffffffffffff;
                      }
                      else {
                        local_78 = pcVar8;
                        pvVar9 = memchr(pcVar8,(int)cVar1,__n_00);
                        uVar10 = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)local_78;
                        pcVar8 = local_78;
                      }
                      if (uVar10 != 0xffffffffffffffff) {
                        std::__cxx11::string::_M_replace
                                  ((ulong)&local_f8,0,(char *)local_f0._0_8_,(ulong)pcVar8);
                        input->_M_str = input->_M_str + uVar10 + 1;
                        input->_M_len = input->_M_len - (uVar10 + 1);
                        goto LAB_0011bf56;
                      }
                    }
                  }
                }
              }
              if (local_f8._M_p != local_f0 + 8) {
                operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
              }
            }
            pSVar14 = (pointer)local_d0._16_8_;
            pvVar15 = (pointer)local_d0._0_8_;
            if ((pointer)local_d0._0_8_ != (pointer)(local_d0 + 0x10)) {
LAB_0011bfeb:
              operator_delete(pvVar15,(ulong)((long)&(((
                                                  _Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                                                  *)&pSVar14->combinator)->_M_impl).
                                                  super__Vector_impl_data._M_start + 1));
            }
          }
        }
        else {
          input->_M_str = input->_M_str + 1;
          input->_M_len = input->_M_len - 1;
          local_f8._M_p = local_f0 + 8;
          local_f0._0_8_ = (pointer)0x0;
          local_f0[8] = '\0';
          local_100._0_5_ = 0x1d00000000;
          local_100 = (pointer)CONCAT44(local_100._4_4_,1);
          if ((input->_M_len == 0) ||
             (((bVar6 = *input->_M_str, 0x19 < (int)(char)(bVar6 & 0xdf) - 0x41U && (bVar6 != 0x5f))
              && (bVar6 != 0x2d)))) {
            bVar5 = false;
          }
          else {
            local_f0._0_8_ = (pointer)0x0;
            local_f0[8] = '\0';
            std::__cxx11::string::push_back((char)&local_f8);
            pcVar8 = input->_M_str + 1;
            input->_M_str = pcVar8;
            input->_M_len = input->_M_len - 1;
            bVar5 = true;
            sVar11 = input->_M_len;
            while (sVar11 != 0) {
              cVar1 = *pcVar8;
              if (((0x19 < ((int)cVar1 & 0xffffffdfU) - 0x41) && (cVar1 != '-')) &&
                 ((cVar1 != '_' && (9 < (int)cVar1 - 0x30U)))) break;
              std::__cxx11::string::push_back((char)&local_f8);
              pcVar8 = input->_M_str + 1;
              input->_M_str = pcVar8;
              input->_M_len = input->_M_len - 1;
              sVar11 = input->_M_len;
            }
          }
          if (bVar5) {
            std::vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>::
            emplace_back<lunasvg::AttributeSelector>
                      (&local_68.attributeSelectors,(AttributeSelector *)&local_100);
          }
LAB_0011baad:
          if (local_f8._M_p != local_f0 + 8) {
            operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
          }
          bVar6 = bVar5 ^ 1;
        }
        bVar5 = true;
      } while (bVar6 == 0);
      bVar16 = bVar6 ^ 1;
LAB_0011c012:
      if (bVar16 == 0) {
        local_d1 = (bVar6 ^ 1) & local_9c == Descendant;
      }
      else {
        std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::
        emplace_back<lunasvg::SimpleSelector>(&local_98,&local_68);
      }
      std::vector<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>::
      ~vector(&local_68.pseudoClassSelectors);
      std::vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>::~vector
                (&local_68.attributeSelectors);
      bVar6 = local_d1;
      if (bVar16 == 0) goto LAB_0011c111;
      sVar11 = input->_M_len;
      if (sVar11 == 0) {
        CVar13 = None;
      }
      else {
        CVar13 = None;
        pbVar2 = (byte *)input->_M_str;
        do {
          sVar11 = sVar11 - 1;
          if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0))
          break;
          input->_M_str = (char *)(pbVar2 + 1);
          input->_M_len = sVar11;
          CVar13 = Descendant;
          pbVar2 = pbVar2 + 1;
        } while (sVar11 != 0);
      }
      bVar5 = skipDelimiterAndOptionalSpaces(input,'>');
      CVar12 = Child;
      if (!bVar5) {
        bVar5 = skipDelimiterAndOptionalSpaces(input,'+');
        CVar12 = DirectAdjacent;
        if ((!bVar5) && (bVar5 = skipDelimiterAndOptionalSpaces(input,'~'), CVar12 = CVar13, bVar5))
        {
          CVar12 = InDirectAdjacent;
        }
      }
    } while (CVar12 != None);
    bVar6 = 1;
LAB_0011c111:
    if ((bVar6 & 1) == 0) {
      std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::~vector
                (&local_98);
LAB_0011c15a:
      return (bool)(bVar6 & 1);
    }
    std::
    vector<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>,std::allocator<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>>>
    ::emplace_back<std::vector<lunasvg::SimpleSelector,std::allocator<lunasvg::SimpleSelector>>>
              (local_70,&local_98);
    std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::~vector
              (&local_98);
    if (((bVar6 & 1) == 0) || (bVar5 = skipDelimiterAndOptionalSpaces(input,','), !bVar5))
    goto LAB_0011c15a;
  } while( true );
}

Assistant:

static bool parseSelectors(std::string_view& input, SelectorList& selectors)
{
    do {
        Selector selector;
        if(!parseSelector(input, selector))
            return false;
        selectors.push_back(std::move(selector));
    } while(skipDelimiterAndOptionalSpaces(input, ','));
    return true;
}